

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::resize_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          ssize_t sw,ssize_t sh)

{
  uint64_t *puVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  invalid_argument *this_00;
  ssize_t xx;
  long lVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  uint64_t sg21;
  uint64_t sr21;
  uint64_t sa22;
  uint64_t sb22;
  uint64_t sg22;
  uint64_t sr22;
  uint64_t sa12;
  uint64_t sb12;
  uint64_t sg12;
  uint64_t sr12;
  uint64_t sa11;
  uint64_t sb11;
  uint64_t sg11;
  uint64_t sr11;
  uint64_t *a;
  uint64_t local_130 [5];
  ulong local_108;
  double local_100;
  uint64_t local_f8 [12];
  double local_98;
  double local_90;
  double local_88;
  long local_80;
  ssize_t local_78;
  long local_70;
  double local_68;
  double local_60;
  double local_58;
  Image *local_50;
  ssize_t local_48;
  long local_40;
  double local_38;
  
  local_130[4] = w;
  local_80 = y;
  local_50 = this;
  local_48 = x;
  if ((w < 1) || (h < 1)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(this_00,"source width/height must be specified");
    __cxa_throw(this_00,&::std::invalid_argument::typeinfo,
                ::std::invalid_argument::~invalid_argument);
  }
  if (sw < 0) {
    sw = source->width;
  }
  if (sh < 0) {
    sh = source->height;
  }
  local_88 = (double)(h + -1);
  local_90 = (double)(sh + -1);
  local_98 = (double)sy;
  local_58 = (double)(w + -1);
  local_60 = (double)(sw + -1);
  local_68 = (double)sx;
  local_70 = 0;
  local_78 = h;
  do {
    local_100 = ((double)local_70 / local_88) * local_90;
    dVar10 = local_100 + local_98;
    uVar4 = (ulong)dVar10;
    uVar4 = (long)(dVar10 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
    local_108 = uVar4 + 1;
    auVar12._8_4_ = (int)(uVar4 >> 0x20);
    auVar12._0_8_ = uVar4;
    auVar12._12_4_ = 0x45300000;
    local_100 = local_100 -
                ((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0));
    local_38 = 1.0 - local_100;
    local_40 = local_80 + local_70;
    lVar9 = 0;
    do {
      dVar10 = ((double)lVar9 / local_58) * local_60;
      dVar11 = dVar10 + local_68;
      uVar5 = (ulong)dVar11;
      uVar5 = (long)(dVar11 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5;
      local_f8[0xb] = 0;
      local_f8[10] = 0;
      local_f8[9] = 0;
      local_f8[8] = 0;
      local_f8[7] = 0;
      local_f8[6] = 0;
      local_f8[5] = 0;
      local_f8[4] = 0;
      local_130[3] = 0;
      local_130[2] = 0;
      local_130[1] = 0;
      local_130[0] = 0;
      local_f8[3] = 0;
      local_f8[2] = 0;
      local_f8[1] = 0;
      local_f8[0] = 0;
      read_pixel(source,uVar5,uVar4,local_f8 + 0xb,local_f8 + 10,local_f8 + 9,local_f8 + 8);
      auVar13._8_4_ = (int)(uVar5 >> 0x20);
      auVar13._0_8_ = uVar5;
      auVar13._12_4_ = 0x45300000;
      dVar10 = dVar10 - ((auVar13._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0));
      if ((local_100 != 0.0) || (NAN(local_100))) {
        read_pixel(source,uVar5,local_108,local_f8 + 7,local_f8 + 6,local_f8 + 5,local_f8 + 4);
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          read_pixel(source,uVar5 + 1,uVar4,local_130 + 3,local_130 + 2,local_130 + 1,local_130);
          a = local_f8;
          puVar1 = local_f8;
          puVar2 = local_f8;
          puVar3 = local_f8;
          uVar6 = local_108;
LAB_0011420f:
          read_pixel(source,uVar5 + 1,uVar6,puVar1 + 3,puVar2 + 2,puVar3 + 1,a);
        }
      }
      else if ((dVar10 != 0.0) || (NAN(dVar10))) {
        a = local_130;
        puVar1 = local_130;
        puVar2 = local_130;
        puVar3 = local_130;
        uVar6 = uVar4;
        goto LAB_0011420f;
      }
      auVar17._8_4_ = (int)(local_f8[0xb] >> 0x20);
      auVar17._0_8_ = local_f8[0xb];
      auVar17._12_4_ = 0x45300000;
      dVar16 = local_38 * (1.0 - dVar10);
      dVar11 = (1.0 - dVar10) * local_100;
      dVar18 = local_38 * dVar10;
      dVar10 = dVar10 * local_100;
      dVar21 = (((double)CONCAT44(0x45300000,(int)(local_f8[3] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[3]) - 4503599627370496.0)) * dVar10 +
               (((double)CONCAT44(0x45300000,(int)(local_130[3] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)local_130[3]) - 4503599627370496.0)) * dVar18 +
               ((auVar17._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[0xb]) - 4503599627370496.0)) * dVar16 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[7] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[7]) - 4503599627370496.0)) * dVar11;
      uVar5 = (ulong)dVar21;
      dVar19 = (((double)CONCAT44(0x45300000,(int)(local_f8[2] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[2]) - 4503599627370496.0)) * dVar10 +
               (((double)CONCAT44(0x45300000,(int)(local_130[2] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)local_130[2]) - 4503599627370496.0)) * dVar18 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[10] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)local_f8[10]) - 4503599627370496.0)) * dVar16 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[6] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[6]) - 4503599627370496.0)) * dVar11;
      uVar6 = (ulong)dVar19;
      dVar20 = (((double)CONCAT44(0x45300000,(int)(local_f8[1] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[1]) - 4503599627370496.0)) * dVar10 +
               (((double)CONCAT44(0x45300000,(int)(local_130[1] >> 0x20)) - 1.9342813113834067e+25)
               + ((double)CONCAT44(0x43300000,(int)local_130[1]) - 4503599627370496.0)) * dVar18 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[9] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[9]) - 4503599627370496.0)) * dVar16 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[5] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[5]) - 4503599627370496.0)) * dVar11;
      uVar7 = (ulong)dVar20;
      auVar14._8_4_ = (int)(local_130[0] >> 0x20);
      auVar14._0_8_ = local_130[0];
      auVar14._12_4_ = 0x45300000;
      auVar15._8_4_ = (int)(local_f8[0] >> 0x20);
      auVar15._0_8_ = local_f8[0];
      auVar15._12_4_ = 0x45300000;
      dVar10 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[0]) - 4503599627370496.0)) * dVar10 +
               ((auVar14._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_130[0]) - 4503599627370496.0)) * dVar18 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[8] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[8]) - 4503599627370496.0)) * dVar16 +
               (((double)CONCAT44(0x45300000,(int)(local_f8[4] >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_f8[4]) - 4503599627370496.0)) * dVar11;
      uVar8 = (ulong)dVar10;
      write_pixel(local_50,local_48 + lVar9,local_40,
                  (long)(dVar21 - 9.223372036854776e+18) & (long)uVar5 >> 0x3f | uVar5,
                  (long)(dVar19 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6,
                  (long)(dVar20 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7,
                  (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8);
      lVar9 = lVar9 + 1;
    } while (local_130[4] != lVar9);
    local_70 = local_70 + 1;
    if (local_70 == local_78) {
      return;
    }
  } while( true );
}

Assistant:

void Image::resize_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, ssize_t sw, ssize_t sh) {
  if (w <= 0 || h <= 0) {
    throw invalid_argument("source width/height must be specified");
  }
  if (sw < 0) {
    sw = source.get_width();
  }
  if (sh < 0) {
    sh = source.get_height();
  }

  for (ssize_t yy = 0; yy < h; yy++) {
    double y_rel_dist = static_cast<double>(yy) / (h - 1);
    double source_y_progress = y_rel_dist * (sh - 1);
    size_t source_y1 = sy + source_y_progress;
    size_t source_y2 = source_y1 + 1;
    double source_y2_factor = source_y_progress - source_y1;
    double source_y1_factor = 1.0 - source_y2_factor;

    for (ssize_t xx = 0; xx < w; xx++) {
      double x_rel_dist = static_cast<double>(xx) / (w - 1);
      double source_x_progress = x_rel_dist * (sw - 1);
      size_t source_x1 = sx + source_x_progress;
      size_t source_x2 = source_x1 + 1;
      double source_x2_factor = source_x_progress - source_x1;
      double source_x1_factor = 1.0 - source_x2_factor;

      uint64_t sr11 = 0, sg11 = 0, sb11 = 0, sa11 = 0;
      uint64_t sr12 = 0, sg12 = 0, sb12 = 0, sa12 = 0;
      uint64_t sr21 = 0, sg21 = 0, sb21 = 0, sa21 = 0;
      uint64_t sr22 = 0, sg22 = 0, sb22 = 0, sa22 = 0;
      source.read_pixel(source_x1, source_y1, &sr11, &sg11, &sb11, &sa11);
      if (source_y2_factor != 0.0) {
        source.read_pixel(source_x1, source_y2, &sr12, &sg12, &sb12, &sa12);
      }
      if (source_x2_factor != 0.0) {
        source.read_pixel(source_x2, source_y1, &sr21, &sg21, &sb21, &sa21);
      }
      if (source_x2_factor != 0.0 && source_y2_factor != 0.0) {
        source.read_pixel(source_x2, source_y2, &sr22, &sg22, &sb22, &sa22);
      }

      uint64_t dr = sr11 * (source_x1_factor * source_y1_factor) +
          sr12 * (source_x1_factor * source_y2_factor) +
          sr21 * (source_x2_factor * source_y1_factor) +
          sr22 * (source_x2_factor * source_y2_factor);
      uint64_t dg = sg11 * (source_x1_factor * source_y1_factor) +
          sg12 * (source_x1_factor * source_y2_factor) +
          sg21 * (source_x2_factor * source_y1_factor) +
          sg22 * (source_x2_factor * source_y2_factor);
      uint64_t db = sb11 * (source_x1_factor * source_y1_factor) +
          sb12 * (source_x1_factor * source_y2_factor) +
          sb21 * (source_x2_factor * source_y1_factor) +
          sb22 * (source_x2_factor * source_y2_factor);
      uint64_t da = sa11 * (source_x1_factor * source_y1_factor) +
          sa12 * (source_x1_factor * source_y2_factor) +
          sa21 * (source_x2_factor * source_y1_factor) +
          sa22 * (source_x2_factor * source_y2_factor);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}